

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_(CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  Bitset *in_RDX;
  Bitset *flags_local;
  CompilerGLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)this);
  bVar1 = Bitset::get(in_RDX,0xe);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"flat ");
  }
  bVar1 = Bitset::get(in_RDX,0xd);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"noperspective ");
  }
  bVar1 = Bitset::get(in_RDX,0x10);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"centroid ");
  }
  bVar1 = Bitset::get(in_RDX,0xf);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"patch ");
  }
  bVar1 = Bitset::get(in_RDX,0x11);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"sample ");
  }
  bVar1 = Bitset::get(in_RDX,0x12);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"invariant ");
  }
  bVar1 = Bitset::get(in_RDX,4999);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)this,"__explicitInterpAMD ");
  }
  return this;
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant))
		res += "invariant ";
	if (flags.get(DecorationExplicitInterpAMD))
		res += "__explicitInterpAMD ";

	return res;
}